

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

int __thiscall Liby::Connection::init(Connection *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  undefined1 local_30 [16];
  code *local_20;
  code *local_18;
  
  std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Liby::Connection,void>
            ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)local_30,
             (__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<Liby::Connection>);
  std::__shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->self_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  local_30._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:20:19)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:20:19)>
             ::_M_manager;
  local_30._0_8_ = this;
  std::function<void_()>::operator=
            (&((this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              readEventCallback_,(function<void_()> *)local_30);
  std::_Function_base::~_Function_base((_Function_base *)local_30);
  local_30._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:21:19)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:21:19)>
             ::_M_manager;
  local_30._0_8_ = this;
  std::function<void_()>::operator=
            (&((this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              writEventCallback_,(function<void_()> *)local_30);
  std::_Function_base::~_Function_base((_Function_base *)local_30);
  local_30._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:22:19)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:22:19)>
             ::_M_manager;
  local_30._0_8_ = this;
  std::function<void_()>::operator=
            (&((this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              erroEventCallback_,(function<void_()> *)local_30);
  std::_Function_base::~_Function_base((_Function_base *)local_30);
  return extraout_EAX;
}

Assistant:

void Connection::init() {
    self_ = shared_from_this();
    chan_->onRead([this] { handleReadEvent(); });
    chan_->onWrit([this] { handleWritEvent(); });
    chan_->onErro([this] { handleErroEvent(); });
}